

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O2

void Abc_NtkDontCareSimulateSetElem(Odc_Man_t *p)

{
  Odc_Lit_t Lit;
  uint *p_00;
  uint *q;
  int k;
  int i;
  
  for (i = 0; i < p->nVarsMax; i = i + 1) {
    Lit = Odc_Var(p,i);
    p_00 = Odc_ObjTruth(p,Lit);
    q = (uint *)Vec_PtrEntry(p->vTruthsElem,i);
    Abc_InfoCopy(p_00,q,p->nWords);
  }
  return;
}

Assistant:

void Abc_NtkDontCareSimulateSetElem( Odc_Man_t * p )
{
    unsigned * pData, * pData2;
    int k;
    for ( k = 0; k < p->nVarsMax; k++ )
    {
        pData = Odc_ObjTruth( p, Odc_Var(p, k) );
        pData2 = (unsigned *)Vec_PtrEntry( p->vTruthsElem, k );
        Abc_InfoCopy( pData, pData2, p->nWords );
    }
}